

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_func.cc
# Opt level: O0

void __thiscall Function::Prepare(Function *this,Env *env)

{
  Param *this_00;
  bool bVar1;
  void *pvVar2;
  iterator data_type;
  reference ppPVar3;
  Env *in_RSI;
  long in_RDI;
  undefined1 unaff_retaddr;
  ID *in_stack_00000008;
  Env *in_stack_00000010;
  Param *p;
  iterator i;
  vector<Param_*,_std::allocator<Param_*>_> *in_stack_ffffffffffffff98;
  Object *in_stack_ffffffffffffffa0;
  Env *in_stack_ffffffffffffffa8;
  Env *in_stack_ffffffffffffffb0;
  __normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_>
  in_stack_ffffffffffffffd8;
  IDType in_stack_ffffffffffffffe4;
  ID *in_stack_ffffffffffffffe8;
  
  Env::AddID(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
             (Type *)in_stack_ffffffffffffffd8._M_current);
  Env::SetEvaluated(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
  pvVar2 = operator_new(0x48);
  Env::Env(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  *(void **)(in_RDI + 0x48) = pvVar2;
  if (*(long *)(in_RDI + 0x60) != 0) {
    data_type = std::vector<Param_*,_std::allocator<Param_*>_>::begin(in_stack_ffffffffffffff98);
    while( true ) {
      std::vector<Param_*,_std::allocator<Param_*>_>::end(in_stack_ffffffffffffff98);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_>
                          *)in_stack_ffffffffffffffa0,
                         (__normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_>
                          *)in_stack_ffffffffffffff98);
      if (!bVar1) break;
      ppPVar3 = __gnu_cxx::
                __normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_>::
                operator*((__normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_>
                           *)&stack0xffffffffffffffd8);
      this_00 = *ppPVar3;
      in_stack_ffffffffffffffa0 = *(Object **)(in_RDI + 0x48);
      Param::id(this_00);
      Param::type(this_00);
      Env::AddID(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                 (Type *)data_type._M_current);
      Param::id(this_00);
      Env::SetEvaluated(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
      __gnu_cxx::__normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_>::
      operator++((__normal_iterator<Param_**,_std::vector<Param_*,_std::allocator<Param_*>_>_> *)
                 &stack0xffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void Function::Prepare(Env* env)
	{
	env->AddID(id_, FUNC_ID, type_);
	env->SetEvaluated(id_);

	env_ = new Env(env, this);

	foreach (i, ParamList, params_)
		{
		Param* p = *i;
		env_->AddID(p->id(), FUNC_PARAM, p->type());
		env_->SetEvaluated(p->id());
		}
	}